

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_common.hpp
# Opt level: O0

void unodb::detail::dump_key<unsigned_long>(ostream *os,unsigned_long key)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  undefined8 uVar4;
  void *this;
  unsigned_long key_local;
  ostream *os_local;
  
  poVar3 = std::operator<<(os,"key: 0x");
  uVar4 = std::ostream::operator<<(poVar3,std::hex);
  _Var1 = std::setfill<char>('0');
  poVar3 = std::operator<<(uVar4,_Var1._M_c);
  _Var2 = std::setw(8);
  poVar3 = std::operator<<(poVar3,_Var2);
  this = (void *)std::ostream::operator<<(poVar3,key);
  std::ostream::operator<<(this,std::dec);
  return;
}

Assistant:

[[gnu::cold]] void dump_key(std::ostream &os, T key) {
  if constexpr (std::is_same_v<T, key_view>) {
    const auto sz = key.size_bytes();
    os << "key(" << sz << "): 0x";
    for (std::size_t i = 0; i < sz; ++i) unodb::detail::dump_byte(os, key[i]);
  } else {
    os << "key: 0x" << std::hex << std::setfill('0') << std::setw(sizeof(key))
       << key << std::dec;
  }
}